

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_overflow.cpp
# Opt level: O0

int main(void)

{
  initializer_list<int> __l;
  int *piVar1;
  allocator<int> local_41;
  int local_40 [4];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<int,_std::allocator<int>_> v;
  
  local_40[0] = 0xc;
  local_40[1] = 0x17;
  local_40[2] = 0x22;
  local_40[3] = 0x2d;
  local_30 = local_40;
  local_28 = 4;
  std::allocator<int>::allocator(&local_41);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_20,__l,&local_41);
  std::allocator<int>::~allocator(&local_41);
  std::vector<int,_std::allocator<int>_>::reserve((vector<int,_std::allocator<int>_> *)local_20,8);
  piVar1 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)local_20);
  piVar1[6] = 0;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_20);
  return 0;
}

Assistant:

int main() {
  std::vector<int> v = { 12, 23, 34, 45 };
  v.reserve(8);
  v.data()[6] = 0;
}